

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_issuer_source_static_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_3::CertIssuerSourceStaticTest_AddCertsGetCertsAndClear_Test::
~CertIssuerSourceStaticTest_AddCertsGetCertsAndClear_Test
          (CertIssuerSourceStaticTest_AddCertsGetCertsAndClear_Test *this)

{
  CertIssuerSourceStaticTest_AddCertsGetCertsAndClear_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(CertIssuerSourceStaticTest, AddCertsGetCertsAndClear) {
  std::string test_dir = "testdata/cert_issuer_source_static_unittest/";
  std::shared_ptr<const ParsedCertificate> cert1 =
      ReadCertFromFile(test_dir + "root.pem");
  ASSERT_TRUE(cert1);
  std::shared_ptr<const ParsedCertificate> cert2 =
      ReadCertFromFile(test_dir + "i1_1.pem");
  ASSERT_TRUE(cert2);
  std::shared_ptr<const ParsedCertificate> cert3 =
      ReadCertFromFile(test_dir + "i1_2.pem");
  ASSERT_TRUE(cert3);

  CertIssuerSourceStatic source;
  EXPECT_TRUE(source.Certs().empty());
  EXPECT_EQ(source.size(), 0u);

  source.AddCert(cert1);
  EXPECT_THAT(source.Certs(), testing::UnorderedElementsAre(cert1));
  EXPECT_EQ(source.size(), 1u);

  source.AddCert(cert2);
  EXPECT_THAT(source.Certs(), testing::UnorderedElementsAre(cert1, cert2));
  EXPECT_EQ(source.size(), 2u);

  source.AddCert(cert3);
  EXPECT_THAT(source.Certs(),
              testing::UnorderedElementsAre(cert1, cert2, cert3));
  EXPECT_EQ(source.size(), 3u);

  source.Clear();
  EXPECT_TRUE(source.Certs().empty());
  EXPECT_EQ(source.size(), 0u);
}